

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

string * google::protobuf::compiler::(anonymous_namespace)::CreatePluginArg_abi_cxx11_(void)

{
  bool bVar1;
  LogMessage *this;
  string *in_RDI;
  string plugin_path;
  string_view local_68 [3];
  AlphaNum local_38;
  
  plugin_path._M_dataplus._M_p = (pointer)&plugin_path.field_2;
  plugin_path._M_string_length = 0;
  plugin_path.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&plugin_path);
  if (plugin_path._M_string_length != 0) {
    bVar1 = File::Exists(&plugin_path);
    if (bVar1) {
      local_68[0] = absl::lts_20250127::NullSafeStringView("--plugin=prefix-gen-plug=");
      local_38.piece_._M_len = plugin_path._M_string_length;
      local_38.piece_._M_str = plugin_path._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                (in_RDI,(lts_20250127 *)local_68,&local_38,(AlphaNum *)plugin_path._M_string_length)
      ;
      goto LAB_007f93d7;
    }
  }
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            ((LogMessage *)local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
             ,0x7f);
  this = absl::lts_20250127::log_internal::LogMessage::operator<<
                   ((LogMessage *)local_68,
                    (char (*) [64])"Plugin executable not found.  Plugin tests are likely to fail. "
                   );
  absl::lts_20250127::log_internal::LogMessage::operator<<(this,&plugin_path);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,anon_var_dwarf_651463 + 5,(allocator<char> *)local_68);
LAB_007f93d7:
  std::__cxx11::string::~string((string *)&plugin_path);
  return in_RDI;
}

Assistant:

std::string CreatePluginArg() {
  std::string plugin_path;
#ifdef GOOGLE_PROTOBUF_TEST_PLUGIN_PATH
  plugin_path = GOOGLE_PROTOBUF_TEST_PLUGIN_PATH;
#else
  const char* possible_paths[] = {
      // When building with shared libraries, libtool hides the real
      // executable
      // in .libs and puts a fake wrapper in the current directory.
      // Unfortunately, due to an apparent bug on Cygwin/MinGW, if one program
      // wrapped in this way (e.g. protobuf-tests.exe) tries to execute
      // another
      // program wrapped in this way (e.g. test_plugin.exe), the latter fails
      // with error code 127 and no explanation message.  Presumably the
      // problem
      // is that the wrapper for protobuf-tests.exe set some environment
      // variables that confuse the wrapper for test_plugin.exe.  Luckily, it
      // turns out that if we simply invoke the wrapped test_plugin.exe
      // directly, it works -- I guess the environment variables set by the
      // protobuf-tests.exe wrapper happen to be correct for it too.  So we do
      // that.
      ".libs/test_plugin.exe",  // Win32 w/autotool (Cygwin / MinGW)
      "test_plugin.exe",        // Other Win32 (MSVC)
      "test_plugin",            // Unix
  };
  for (int i = 0; i < ABSL_ARRAYSIZE(possible_paths); ++i) {
    if (access(possible_paths[i], F_OK) == 0) {
      plugin_path = possible_paths[i];
      break;
    }
  }
#endif

  if (plugin_path.empty() || !File::Exists(plugin_path)) {
    ABSL_LOG(ERROR)
        << "Plugin executable not found.  Plugin tests are likely to fail. "
        << plugin_path;
    return "";
  }
  return absl::StrCat("--plugin=prefix-gen-plug=", plugin_path);
}